

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

ulong __thiscall nuraft::buffer::get_ulong(buffer *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  overflow_error *this_00;
  ulong uVar4;
  long lVar5;
  buffer *pbVar6;
  
  uVar1 = *(uint *)this;
  uVar2 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar2 = 0xffff;
  }
  uVar4 = (ulong)(uVar1 >> 0x10);
  if ((int)uVar1 < 0) {
    uVar4 = (ulong)*(uint *)(this + 4);
    if ((uVar2 & uVar1) - uVar4 < 8) goto LAB_001b0d74;
    lVar5 = 8;
  }
  else {
    if ((uVar2 & uVar1) - uVar4 < 8) {
LAB_001b0d74:
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error
                (this_00,"insufficient buffer available for an ulong value");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    lVar5 = 4;
  }
  pbVar6 = this + uVar4 + lVar5;
  uVar3 = 0;
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
    uVar3 = uVar3 + ((ulong)(byte)*pbVar6 << ((byte)lVar5 & 0x3f));
    pbVar6 = pbVar6 + 1;
  }
  if ((int)uVar1 < 0) {
    *(int *)(this + 4) = *(int *)(this + 4) + 8;
  }
  else {
    *(short *)(this + 2) = (short)(uVar1 >> 0x10) + 8;
  }
  return uVar3;
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}